

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceInfo.cpp
# Opt level: O3

EndpointInfo * __thiscall
helics::InterfaceInfo::getEndpoint(InterfaceInfo *this,InterfaceHandle handle)

{
  shared_guarded<gmlc::containers::DualMappedPointerVector<EndpointInfo,_std::string,_InterfaceHandle>_>
  *psVar1;
  const_iterator cVar2;
  _Head_base<0UL,_helics::EndpointInfo_*,_false> _Var3;
  key_type local_34;
  shared_guarded<gmlc::containers::DualMappedPointerVector<EndpointInfo,_std::string,_InterfaceHandle>_>
  *local_30;
  unique_lock<std::shared_mutex> local_28;
  
  local_30 = &this->endpoints;
  local_28._M_device = &(this->endpoints).m_mutex;
  local_28._M_owns = false;
  local_34.hid = handle.hid;
  std::unique_lock<std::shared_mutex>::lock(&local_28);
  psVar1 = local_30;
  local_28._M_owns = true;
  cVar2 = std::
          _Hashtable<helics::InterfaceHandle,_std::pair<const_helics::InterfaceHandle,_unsigned_long>,_std::allocator<std::pair<const_helics::InterfaceHandle,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<helics::InterfaceHandle>,_std::hash<helics::InterfaceHandle>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(local_30->m_obj).lookup2._M_h,&local_34);
  if (cVar2.
      super__Node_iterator_base<std::pair<const_helics::InterfaceHandle,_unsigned_long>,_false>.
      _M_cur == (__node_type *)0x0) {
    _Var3._M_head_impl = (EndpointInfo *)0x0;
  }
  else {
    _Var3._M_head_impl =
         *(EndpointInfo **)
          &(psVar1->m_obj).dataStorage.
           super__Vector_base<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start
           [*(long *)((long)cVar2.
                            super__Node_iterator_base<std::pair<const_helics::InterfaceHandle,_unsigned_long>,_false>
                            ._M_cur + 0x10)]._M_t;
  }
  std::unique_lock<std::shared_mutex>::~unique_lock(&local_28);
  return (EndpointInfo *)
         (tuple<helics::EndpointInfo_*,_std::default_delete<helics::EndpointInfo>_>)
         _Var3._M_head_impl;
}

Assistant:

EndpointInfo* InterfaceInfo::getEndpoint(InterfaceHandle handle)
{
    return endpoints.lock()->find(handle);
}